

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

void __thiscall
HttpReqThread::HttpReqThread
          (HttpReqThread *this,vm_val_t *id,char *url,char *verb,int32_t options,char *hdrs,
          vm_val_t *body,char *body_type,vm_rcdesc *rc)

{
  OS_Counter *pOVar1;
  long *plVar2;
  ushort uVar3;
  bool bVar4;
  anon_union_8_8_cb74652f_for_val aVar5;
  undefined4 uVar6;
  TadsMessageQueue *pTVar7;
  int iVar8;
  vm_globalvar_t *pvVar9;
  ulong uVar10;
  OS_HttpPayload *this_00;
  CVmDataSource *stream;
  uint uVar11;
  long lVar12;
  unsigned_short uVar13;
  size_t sVar14;
  char *pcVar15;
  HttpReqThread *mime_type;
  char *pcVar16;
  iter_body_table_ctx ctx;
  
  OS_Thread::OS_Thread(&this->super_OS_Thread);
  (this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__HttpReqThread_0034acd0;
  (this->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__HttpReqThread_0034ad00;
  this->vmg = (vm_globals *)0x0;
  pTVar7 = G_net_queue_X;
  this->queue = G_net_queue_X;
  if (pTVar7 != (TadsMessageQueue *)0x0) {
    LOCK();
    pOVar1 = &(pTVar7->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  pvVar9 = CVmObjTable::create_global_var(&G_obj_table_X);
  this->idg = pvVar9;
  uVar6 = *(undefined4 *)&id->field_0x4;
  aVar5 = id->val;
  (pvVar9->val).typ = id->typ;
  *(undefined4 *)&(pvVar9->val).field_0x4 = uVar6;
  (pvVar9->val).val = aVar5;
  this->options = options;
  uVar3 = *(ushort *)url;
  uVar10 = (ulong)uVar3;
  plVar2 = (long *)(url + 2);
  if (uVar10 < 8) {
    *(undefined8 *)&this->https = 0;
    *(undefined8 *)((long)&this->host + 4) = 0;
    *(undefined4 *)((long)&this->resource + 4) = 0;
    this->port = 0x50;
    if (uVar3 == 7) goto LAB_0020076a;
    lVar12 = 0;
  }
  else {
    lVar12 = *plVar2;
    this->https = (uint)(lVar12 == 0x2f2f3a7370747468);
    uVar13 = 0x50;
    if (lVar12 == 0x2f2f3a7370747468) {
      uVar13 = 0x1bb;
    }
    this->host = (char *)0x0;
    this->resource = (char *)0x0;
    this->port = uVar13;
LAB_0020076a:
    bVar4 = (int)*plVar2 != 0x70747468;
    lVar12 = 7;
    if (*(int *)(url + 5) != 0x2f2f3a70 || bVar4) {
      lVar12 = 0;
    }
    if ((7 < uVar3) && (*(int *)(url + 5) != 0x2f2f3a70 || bVar4)) {
      lVar12 = (ulong)(*plVar2 == 0x2f2f3a7370747468) << 3;
    }
  }
  pcVar15 = (char *)((long)plVar2 + lVar12);
  bVar4 = true;
  sVar14 = uVar10 - lVar12;
  pcVar16 = pcVar15;
  if (sVar14 == 0) {
    sVar14 = 0;
  }
  else {
    do {
      if ((*pcVar16 == '/') || (*pcVar16 == ':')) {
        bVar4 = false;
        goto LAB_002007f3;
      }
      pcVar16 = pcVar16 + 1;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
    sVar14 = 0;
    pcVar16 = url + uVar10 + 2;
  }
LAB_002007f3:
  pcVar15 = lib_copy_str(pcVar15,(long)pcVar16 - (long)pcVar15);
  this->host = pcVar15;
  if (!bVar4) {
    if (*pcVar16 != ':') {
LAB_00200852:
      pcVar16 = lib_copy_str(pcVar16,sVar14);
      goto LAB_0020085d;
    }
    this->port = 0;
    sVar14 = sVar14 - 1;
    if (sVar14 != 0) {
      iVar8 = 0;
      do {
        pcVar16 = pcVar16 + 1;
        if (*pcVar16 == 0x2f) goto LAB_00200852;
        uVar11 = (int)*pcVar16 - 0x30;
        if (uVar11 < 10) {
          iVar8 = uVar11 + iVar8 * 10;
          this->port = (unsigned_short)iVar8;
        }
        sVar14 = sVar14 - 1;
      } while (sVar14 != 0);
    }
  }
  pcVar16 = lib_copy_str("/");
LAB_0020085d:
  this->resource = pcVar16;
  pcVar16 = lib_copy_str(verb + 2,(ulong)*(ushort *)verb);
  this->verb = pcVar16;
  if (hdrs == (char *)0x0) {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = lib_copy_str(hdrs + 2,(ulong)*(ushort *)hdrs);
  }
  this->hdrs = pcVar16;
  this->body = (OS_HttpPayload *)0x0;
  if (body != (vm_val_t *)0x0) {
    this_00 = (OS_HttpPayload *)operator_new(0x10);
    OS_HttpPayload::OS_HttpPayload(this_00);
    this->body = this_00;
    if ((body->typ == VM_OBJ) &&
       (iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[(body->val).obj >> 0xc]
                                       [(body->val).obj & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[(body->val).obj >> 0xc] + ((body->val).obj & 0xfff),
                           CVmObjLookupTable::metaclass_reg_), iVar8 != 0)) {
      ctx.rc = rc;
      ctx.self = this;
      CVmObjLookupTable::for_each
                ((CVmObjLookupTable *)
                 ((long)&G_obj_table_X.pages_[(body->val).obj >> 0xc]->ptr_ +
                 (ulong)(((body->val).obj & 0xfff) * 0x18)),iter_body_table,&ctx);
    }
    else {
      ctx.self = (HttpReqThread *)0x0;
      stream = val_to_ds(body,(char **)&ctx);
      mime_type = ctx.self;
      if (ctx.self == (HttpReqThread *)0x0) {
        sVar14 = 0;
      }
      else {
        sVar14 = strlen((char *)ctx.self);
      }
      if (body_type != (char *)0x0) {
        sVar14 = (size_t)*(ushort *)body_type;
        mime_type = (HttpReqThread *)(body_type + 2);
      }
      OS_HttpPayload::add(this->body,"",0,"",0,(char *)mime_type,sVar14,stream);
    }
  }
  return;
}

Assistant:

HttpReqThread(VMG_ const vm_val_t *id, const char *url,
                  const char *verb, int32_t options,
                  const char *hdrs, vm_val_t *body, const char *body_type,
                  const vm_rcdesc *rc)
    {
        /* save the VM globals */
        vmg = VMGLOB_ADDR;

        /* add a reference on the net event queue */
        if ((queue = G_net_queue) != 0)
            queue->add_ref();

        /* create a global for the ID value */
        idg = G_obj_table->create_global_var();
        idg->val = *id;

        /* save the option flags */
        this->options = options;

        /* set up to parse the URL */
        size_t urll = vmb_get_len(url);
        url += VMB_LEN;

        /* note whether the scheme is plain http or https */
        https = (urll >= 8 && memcmp(url, "https://", 8) == 0);

        /* we don't have any URL pieces yet */
        host = 0;
        resource = 0;
        port = (https ? 443 : 80);

        /* skip the scheme prefix */
        size_t pfx = (urll >= 7 && memcmp(url, "http://", 7) == 0 ? 7 :
                      urll >= 8 && memcmp(url, "https://", 8) == 0 ? 8 : 0);
        url += pfx, urll -= pfx;

        /* the host name is the part up to the ':', '/', or end of string */
        const char *start;
        for (start = url ; urll > 0 && *url != ':' && *url != '/' ;
             ++url, --urll) ;

        /* save the host name */
        host = lib_copy_str(start, url - start);

        /* parse the port, if present */
        if (urll > 0 && *url == ':')
        {
            /* parse the port number string */
            for (--urll, start = ++url, port = 0 ; urll > 0 && *url != '/' ;
                 ++url, --urll)
            {
                if (is_digit(*url))
                    port = port*10 + value_of_digit(*url);
            }
        }

        /* 
         *   The rest (including the '/') is the resource string.  If there's
         *   nothing left, the resource is implicitly '/'. 
         */
        if (urll > 0)
            resource = lib_copy_str(url, urll);
        else
            resource = lib_copy_str("/");

        /* make null-terminated copies of the various strings */
        this->verb = lib_copy_str(verb + VMB_LEN, vmb_get_len(verb));
        this->hdrs = (hdrs == 0 ? 0 :
                      lib_copy_str(hdrs + VMB_LEN, vmb_get_len(hdrs)));

        /* if there's a content body, set up the payload */
        this->body = 0;
        if (body != 0)
        {
            /* set up an empty payload */
            this->body = new OS_HttpPayload();
            
            /* 
             *   Convert the body to a stream payload, if it's a string or
             *   ByteArray.  If it's a LookupTable, it's a set of form
             *   fields.
             */
            if (body->typ == VM_OBJ
                && CVmObjLookupTable::is_lookup_table_obj(vmg_ body->val.obj))
            {
                /* 
                 *   The body is a LookupTable, so we have a set of form
                 *   fields to encode as HTML form data. 
                 */
                
                /* cast the object value */
                CVmObjLookupTable *tab =
                    (CVmObjLookupTable *)vm_objp(vmg_ body->val.obj);
                
                /* add each key in the table as a form field */
                iter_body_table_ctx ctx(this, rc);
                tab->for_each(vmg_ iter_body_table, &ctx);
            }
            else
            {
                /* 
                 *   It's not a lookup table, so it must be bytes to upload,
                 *   as a string or ByteArray.
                 */
                const char *def_mime_type = 0;
                CVmDataSource *s = val_to_ds(vmg_ body, &def_mime_type);
                
                /* presume we're going to use the default mime type */
                const char *mime_type = def_mime_type;
                size_t mime_type_len =
                    (mime_type != 0 ? strlen(mime_type) : 0);

                /* if the caller specified a mime type, use it instead */
                if (body_type != 0)
                {
                    mime_type = body_type + VMB_LEN;
                    mime_type_len = vmb_get_len(body_type);
                }
                
                /* add the stream */
                this->body->add(
                    "", 0, "", 0, mime_type, mime_type_len, s);
            }
        }
    }